

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

UnknownFieldSet * __thiscall
google::protobuf::internal::
InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
::mutable_unknown_fields_slow
          (InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           *this)

{
  UnknownFieldSet *elem;
  Arena *this_00;
  
  this_00 = (Arena *)this->ptr_;
  if (((ulong)this_00 & 1) != 0) {
    this_00 = *(Arena **)(((ulong)this_00 & 0xfffffffffffffffe) + 8);
  }
  if (this_00 == (Arena *)0x0) {
    elem = (UnknownFieldSet *)operator_new(0x10);
    elem->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
    elem[1].fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
  }
  else {
    elem = (UnknownFieldSet *)
           Arena::AllocateAligned
                     (this_00,(type_info *)
                              &InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                               ::Container::typeinfo,0x10);
    elem->fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
    elem[1].fields_ =
         (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
         0x0;
    Arena::AddListNode(this_00,elem,
                       arena_destruct_object<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                      );
  }
  this->ptr_ = (void *)((ulong)elem | 1);
  elem[1].fields_ =
       (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)
       this_00;
  return elem;
}

Assistant:

GOOGLE_ATTRIBUTE_NOINLINE T* mutable_unknown_fields_slow() {
    Arena* my_arena = arena();
    Container* container = Arena::Create<Container>(my_arena);
    ptr_ = reinterpret_cast<void*>(
        reinterpret_cast<intptr_t>(container) | kTagContainer);
    container->arena = my_arena;
    return &(container->unknown_fields);
  }